

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int pageFreeArray(MemPage *pPg,int iFirst,int nCell,CellArray *pCArray)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  u8 *puVar4;
  u8 *puVar5;
  int iVar6;
  int iVar7;
  u8 *puVar8;
  ulong uVar9;
  long lVar10;
  
  puVar4 = pPg->aData;
  uVar3 = pPg->pBt->usableSize;
  bVar1 = pPg->hdrOffset;
  bVar2 = pPg->childPtrSize;
  lVar10 = (long)iFirst;
  puVar8 = (u8 *)0x0;
  iVar7 = 0;
  iVar6 = 0;
  do {
    if (nCell + iFirst <= lVar10) {
      if (puVar8 != (u8 *)0x0) {
        freeSpace(pPg,(short)puVar8 - (short)puVar4,(u16)iVar7);
      }
      return iVar6;
    }
    puVar5 = pCArray->apCell[lVar10];
    if ((puVar4 + (ulong)bVar2 + (ulong)bVar1 + 8 <= puVar5) && (puVar5 < puVar4 + uVar3)) {
      uVar9 = (ulong)pCArray->szCell[lVar10];
      if (puVar8 == puVar5 + uVar9) {
        uVar9 = (ulong)(iVar7 + (uint)pCArray->szCell[lVar10]);
      }
      else {
        if (puVar8 != (u8 *)0x0) {
          freeSpace(pPg,(short)puVar8 - (short)puVar4,(u16)iVar7);
        }
        if (puVar4 + uVar3 < puVar5 + uVar9) {
          return 0;
        }
      }
      iVar6 = iVar6 + 1;
      iVar7 = (int)uVar9;
      puVar8 = puVar5;
    }
    lVar10 = lVar10 + 1;
  } while( true );
}

Assistant:

static int pageFreeArray(
  MemPage *pPg,                   /* Page to edit */
  int iFirst,                     /* First cell to delete */
  int nCell,                      /* Cells to delete */
  CellArray *pCArray              /* Array of cells */
){
  u8 * const aData = pPg->aData;
  u8 * const pEnd = &aData[pPg->pBt->usableSize];
  u8 * const pStart = &aData[pPg->hdrOffset + 8 + pPg->childPtrSize];
  int nRet = 0;
  int i;
  int iEnd = iFirst + nCell;
  u8 *pFree = 0;
  int szFree = 0;

  for(i=iFirst; i<iEnd; i++){
    u8 *pCell = pCArray->apCell[i];
    if( SQLITE_WITHIN(pCell, pStart, pEnd) ){
      int sz;
      /* No need to use cachedCellSize() here.  The sizes of all cells that
      ** are to be freed have already been computing while deciding which
      ** cells need freeing */
      sz = pCArray->szCell[i];  assert( sz>0 );
      if( pFree!=(pCell + sz) ){
        if( pFree ){
          assert( pFree>aData && (pFree - aData)<65536 );
          freeSpace(pPg, (u16)(pFree - aData), szFree);
        }
        pFree = pCell;
        szFree = sz;
        if( pFree+sz>pEnd ) return 0;
      }else{
        pFree = pCell;
        szFree += sz;
      }
      nRet++;
    }
  }
  if( pFree ){
    assert( pFree>aData && (pFree - aData)<65536 );
    freeSpace(pPg, (u16)(pFree - aData), szFree);
  }
  return nRet;
}